

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_CheckMissileSpawn
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AActor *th;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_004334c5;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    th = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (th != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)th,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004334c5;
        }
        goto LAB_00433476;
      }
    }
    else if (th != (AActor *)0x0) goto LAB_004334b5;
    th = (AActor *)0x0;
LAB_00433476:
    if (numparam == 1) {
      pcVar3 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\x01') {
        bVar1 = P_CheckMissileSpawn(th,param[1].field_0.f);
        if (numret < 1) {
          iVar2 = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x18d1,
                          "int AF_AActor_CheckMissileSpawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetInt(ret,(uint)bVar1);
          iVar2 = 1;
        }
        return iVar2;
      }
      pcVar3 = "param[paramnum].Type == REGT_FLOAT";
    }
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x18d0,
                  "int AF_AActor_CheckMissileSpawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_004334b5:
  pcVar3 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004334c5:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x18cf,
                "int AF_AActor_CheckMissileSpawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckMissileSpawn)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(add);
	ACTION_RETURN_BOOL(P_CheckMissileSpawn(self, add));
}